

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O0

bool __thiscall test_CECoordinates::test_copy(test_CECoordinates *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long *in_RDI;
  CECoordinates obs;
  CECoordinates gal;
  CECoordinates icrs;
  CECoordinates cirs;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  CECoordinates *in_stack_fffffffffffffd20;
  CECoordinates *pCVar5;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  CECoordinates *in_stack_fffffffffffffd40;
  CECoordinates *this_00;
  undefined6 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  CECoordinates *in_stack_fffffffffffffd80;
  undefined4 local_240;
  undefined1 local_239 [33];
  undefined4 local_218;
  allocator local_211;
  string local_210 [80];
  undefined4 local_1c0;
  undefined1 local_1b9 [81];
  undefined4 local_168;
  allocator local_161;
  string local_160 [80];
  undefined4 local_110;
  allocator local_109;
  string local_108 [80];
  undefined4 local_b8;
  undefined1 local_b1 [33];
  undefined4 local_90;
  allocator local_89;
  string local_88 [32];
  undefined4 local_68;
  allocator local_61;
  string local_60 [32];
  undefined4 local_40 [5];
  allocator local_29;
  string local_28 [40];
  
  bVar1 = operator==(in_stack_fffffffffffffd80,
                     (CECoordinates *)
                     CONCAT17(in_stack_fffffffffffffd7f,
                              CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"test_copy",&local_29);
  local_40[0] = 0x97;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,1,local_28,local_40);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  bVar1 = operator!=(in_stack_fffffffffffffd20,
                     (CECoordinates *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"test_copy",&local_61);
  local_68 = 0x98;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,0,local_60,&local_68);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = operator==(in_stack_fffffffffffffd80,
                     (CECoordinates *)
                     CONCAT17(in_stack_fffffffffffffd7f,
                              CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"test_copy",&local_89);
  local_90 = 0x99;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,0,local_88,&local_90);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  bVar2 = operator!=(in_stack_fffffffffffffd20,
                     (CECoordinates *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18))
  ;
  pCVar5 = (CECoordinates *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"test_copy",(allocator *)pCVar5);
  local_b8 = 0x9a;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar2 & 1,1,local_b1 + 1,&local_b8);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  CECoordinates::CECoordinates
            (in_stack_fffffffffffffd40,
             (CECoordinates *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  bVar3 = operator==(pCVar5,(CECoordinates *)
                            CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffd7e,
                                                    in_stack_fffffffffffffd78)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"test_copy",&local_109);
  local_110 = 0x9e;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar3 & 1,local_108,&local_110);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  CECoordinates::CECoordinates
            (in_stack_fffffffffffffd40,
             (CECoordinates *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  bVar1 = operator==(pCVar5,(CECoordinates *)
                            CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffd78)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"test_copy",&local_161);
  local_168 = 0xa2;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar1,local_160,&local_168);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  CECoordinates::CECoordinates
            (in_stack_fffffffffffffd40,
             (CECoordinates *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  bVar1 = operator==(pCVar5,(CECoordinates *)
                            CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffd78)));
  this_00 = (CECoordinates *)local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1b9 + 1),"test_copy",(allocator *)this_00);
  local_1c0 = 0xa6;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar1,local_1b9 + 1,&local_1c0);
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  CECoordinates::CECoordinates
            (this_00,(CECoordinates *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38))
  ;
  bVar4 = operator==(pCVar5,(CECoordinates *)
                            CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffd78)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"test_copy",&local_211);
  local_218 = 0xaa;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar4 & 1,local_210,&local_218);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  CECoordinates::SetCoordinates
            (in_stack_fffffffffffffd20,
             (CECoordinates *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  bVar1 = operator==(pCVar5,(CECoordinates *)
                            CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffd78)));
  pCVar5 = (CECoordinates *)local_239;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_239 + 1),"test_copy",(allocator *)pCVar5);
  local_240 = 0xae;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar1,local_239 + 1,&local_240);
  std::__cxx11::string::~string((string *)(local_239 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_239);
  bVar2 = (**(code **)(*in_RDI + 0x18))();
  CECoordinates::~CECoordinates(pCVar5);
  CECoordinates::~CECoordinates(pCVar5);
  CECoordinates::~CECoordinates(pCVar5);
  CECoordinates::~CECoordinates(pCVar5);
  return (bool)(bVar2 & 1);
}

Assistant:

bool test_CECoordinates::test_copy()
{
    // Make sure the equals and not-equals operators work properly
    test_bool((base_icrs_ == base_icrs_), true, __func__, __LINE__);
    test_bool((base_icrs_ != base_icrs_), false, __func__, __LINE__);
    test_bool((base_icrs_ == base_gal_), false, __func__, __LINE__);
    test_bool((base_icrs_ != base_gal_), true, __func__, __LINE__);

    // Copy CIRS
    CECoordinates cirs = base_cirs_;
    test((cirs == base_cirs_), __func__, __LINE__);

    // Copy ICRS
    CECoordinates icrs = base_icrs_;
    test((icrs == base_icrs_), __func__, __LINE__);

    // Copy Galactic
    CECoordinates gal = base_gal_;
    test((gal == base_gal_), __func__, __LINE__);

    // Copy Observed
    CECoordinates obs = base_obs_;
    test((obs == base_obs_), __func__, __LINE__);

    // Copy coordinates directly
    gal.SetCoordinates(icrs);
    test((gal == icrs), __func__, __LINE__);

    return pass();
}